

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  WhereLoop *pTemplate;
  WhereInfo *pWVar4;
  SrcList *pSVar5;
  Table *pTVar6;
  WhereTerm *pWVar7;
  ExprList *pEVar8;
  UnpackedRecord *p;
  sqlite3 *db;
  KeyInfo *p_00;
  WhereTerm *pTerm;
  bool bVar9;
  short a;
  u8 uVar10;
  LogEst LVar11;
  short sVar12;
  LogEst LVar13;
  int iVar14;
  int iVar15;
  undefined6 extraout_var;
  ushort uVar16;
  int iVar17;
  Index *pIdx;
  ulong uVar18;
  Expr *pA;
  ExprList_item *pEVar19;
  u8 uVar20;
  WhereTerm *pWVar21;
  short sVar22;
  long lVar23;
  Mem *p_01;
  long lVar24;
  bool bVar25;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  i16 local_fa;
  WhereClause *local_f8;
  WhereInfo *local_f0;
  ExprList_item *local_e8;
  Bitmask local_e0;
  ExprList *local_d8;
  LogEst local_cc;
  undefined2 local_ca;
  Index local_c8;
  
  local_fa = -1;
  pTemplate = pBuilder->pNew;
  pWVar4 = pBuilder->pWInfo;
  local_f8 = pBuilder->pWC;
  pSVar5 = pWVar4->pTabList;
  bVar2 = pTemplate->iTab;
  pTVar6 = pSVar5->a[bVar2].pTab;
  pIdx = pSVar5->a[bVar2].pIBIndex;
  local_e0 = mPrereq;
  if (pIdx == (Index *)0x0) {
    if ((pTVar6->tabFlags & 0x20) == 0) {
      pIdx = &local_c8;
      memset(pIdx,0,0x98);
      local_c8.nKeyCol = 1;
      local_c8.nColumn = 1;
      local_c8.aiColumn = &local_fa;
      local_c8.aiRowLogEst = &local_cc;
      local_c8.onError = '\x05';
      local_c8.pTable = pTVar6;
      local_c8.szIdxRow = pTVar6->szTabRow;
      local_c8._99_1_ = local_c8._99_1_ | 3;
      local_cc = pTVar6->nRowLogEst;
      local_ca = 0;
      if ((pSVar5->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_c8.pNext = (pSVar5->a[bVar2].pTab)->pIndex;
      }
    }
    else {
      pIdx = pTVar6->pIndex;
    }
  }
  sVar22 = pTVar6->nRowLogEst;
  iVar15 = 0;
  iVar17 = 0;
  iVar14 = 0;
  local_f0 = pWVar4;
  if (10 < (long)sVar22) {
    LVar11 = sqlite3LogEst((long)sVar22);
    iVar14 = (int)CONCAT62(extraout_var,LVar11) + -0x21;
  }
  if ((((((pBuilder->pOrSet == (WhereOrSet *)0x0) && ((local_f0->wctrlFlags & 0x20) == 0)) &&
        ((local_f0->pParse->db->flags & 0x8000) != 0)) &&
       ((iVar15 = iVar17, pSVar5->a[bVar2].pIBIndex == (Index *)0x0 &&
        (bVar3 = pSVar5->a[bVar2].fg.field_0x1, (bVar3 & 1) == 0)))) && ((bVar3 & 0x28) == 0)) &&
     (((pTVar6->tabFlags & 0x20) == 0 && (iVar17 = local_f8->nTerm, 0 < (long)iVar17)))) {
    pWVar7 = local_f8->a;
    a = (short)iVar14;
    local_e8 = (ExprList_item *)CONCAT44(local_e8._4_4_,iVar14 + sVar22 + 0x1c);
    pTerm = pWVar7;
    do {
      pWVar21 = pTerm + 1;
      iVar15 = 0;
      if ((pTerm->prereqRight & pTemplate->maskSelf) == 0) {
        iVar15 = 0;
        iVar14 = termCanDriveIndex(pTerm,pSVar5->a + bVar2,0);
        if (iVar14 != 0) {
          (pTemplate->u).btree.nEq = 1;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          pTemplate->nLTerm = 1;
          pTemplate->nSkip = 0;
          *pTemplate->aLTerm = pTerm;
          pTemplate->rSetup = a + sVar22;
          if ((pTVar6->pSelect != (Select *)0x0) ||
             (sVar12 = (short)local_e8, (pTVar6->tabFlags & 2) != 0)) {
            sVar12 = a + sVar22 + -10;
          }
          LVar11 = 0;
          if (0 < sVar12) {
            LVar11 = sVar12;
          }
          pTemplate->rSetup = LVar11;
          pTemplate->nOut = 0x2b;
          LVar11 = sqlite3LogEstAdd(a,0x2b);
          pTemplate->rRun = LVar11;
          pTemplate->wsFlags = 0x4000;
          pTemplate->prereq = pTerm->prereqRight | local_e0;
          iVar15 = whereLoopInsert(pBuilder,pTemplate);
        }
      }
    } while ((iVar15 == 0) && (pTerm = pWVar21, pWVar21 < pWVar7 + iVar17));
  }
  if ((iVar15 != 0) || (pIdx == (Index *)0x0)) {
    return iVar15;
  }
  uVar20 = '\x01';
  do {
    if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
        (iVar15 = whereUsablePartialIndex(pSVar5->a[bVar2].iCursor,local_f8,pIdx->pPartIdxWhere),
        iVar15 != 0)) && ((pIdx->field_0x64 & 1) == 0)) {
      LVar11 = *pIdx->aiRowLogEst;
      (pTemplate->u).vtab.idxNum = 0;
      (pTemplate->u).btree.nTop = 0;
      pTemplate->nLTerm = 0;
      pTemplate->nSkip = 0;
      pTemplate->iSortIdx = '\0';
      pTemplate->rSetup = 0;
      pTemplate->prereq = local_e0;
      pTemplate->nOut = LVar11;
      (pTemplate->u).btree.pIndex = pIdx;
      bVar9 = true;
      if ((((pIdx->field_0x63 & 4) == 0) &&
          (pEVar8 = pBuilder->pWInfo->pOrderBy, pEVar8 != (ExprList *)0x0)) && (0 < pEVar8->nExpr))
      {
        iVar15 = pSVar5->a[bVar2].iCursor;
        local_e8 = pEVar8->a;
        lVar23 = 0;
        local_d8 = pEVar8;
        do {
          pA = local_e8[lVar23].pExpr;
          while ((pA != (Expr *)0x0 && ((pA->flags >> 0xc & 1) != 0))) {
            if ((pA->flags >> 0x12 & 1) == 0) {
              pEVar19 = (ExprList_item *)&pA->pLeft;
            }
            else {
              pEVar19 = ((pA->x).pList)->a;
            }
            pA = pEVar19->pExpr;
          }
          if ((pA->op == 0xa2) && (pA->iTable == iVar15)) {
            if (pA->iColumn < 0) {
LAB_00185420:
              bVar9 = false;
              goto LAB_00185431;
            }
            if ((ulong)pIdx->nKeyCol != 0) {
              uVar18 = 0;
              do {
                if (pA->iColumn == pIdx->aiColumn[uVar18]) goto LAB_00185420;
                uVar18 = uVar18 + 1;
              } while (pIdx->nKeyCol != uVar18);
            }
          }
          else if ((pIdx->aColExpr != (ExprList *)0x0) && (pIdx->nKeyCol != 0)) {
            pEVar19 = pIdx->aColExpr->a;
            uVar18 = 0;
            do {
              if ((pIdx->aiColumn[uVar18] == -2) &&
                 (iVar14 = sqlite3ExprCompareSkip(pA,pEVar19->pExpr,iVar15), iVar14 == 0))
              goto LAB_00185420;
              uVar18 = uVar18 + 1;
              pEVar19 = pEVar19 + 1;
            } while (uVar18 < pIdx->nKeyCol);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < local_d8->nExpr);
        bVar9 = true;
      }
LAB_00185431:
      if ((~*(ushort *)&pIdx->field_0x63 & 3) == 0) {
        uVar10 = uVar20;
        if (bVar9) {
          uVar10 = '\0';
        }
        pTemplate->wsFlags = 0x100;
        pTemplate->iSortIdx = uVar10;
        pTemplate->rRun = LVar11 + 0x10;
        whereLoopOutputAdjust(local_f8,pTemplate,LVar11);
        iVar15 = whereLoopInsert(pBuilder,pTemplate);
        pTemplate->nOut = LVar11;
        if (iVar15 != 0) {
          return iVar15;
        }
      }
      else {
        if ((*(ushort *)&pIdx->field_0x63 & 0x20) == 0) {
          bVar25 = (pSVar5->a[bVar2].colUsed & pIdx->colNotIdxed) == 0;
          pTemplate->wsFlags = (bVar25 | 8) << 6;
        }
        else {
          pTemplate->wsFlags = 0x240;
          bVar25 = true;
        }
        uVar10 = uVar20;
        if ((((!bVar9) || (uVar10 = '\0', (pTVar6->tabFlags & 0x20) != 0)) ||
            (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
           ((((bVar25 && ((pIdx->field_0x63 & 4) == 0)) &&
             ((pIdx->szIdxRow < pTVar6->szTabRow &&
              (((local_f0->wctrlFlags & 4) == 0 && (sqlite3Config.bUseCis != 0)))))) &&
            ((local_f0->pParse->db->dbOptFlags & 0x20) == 0)))) {
          pTemplate->iSortIdx = uVar10;
          pTemplate->rRun = (short)((pIdx->szIdxRow * 0xf) / (int)pTVar6->szTabRow) + LVar11 + 1;
          if (!bVar25) {
            sVar22 = LVar11 + 0x10;
            if (0 < (local_f0->sWC).nTerm) {
              iVar15 = pSVar5->a[bVar2].iCursor;
              lVar23 = 0x14;
              lVar24 = 0;
              do {
                pWVar7 = (local_f0->sWC).a;
                iVar14 = sqlite3ExprCoveredByIndex
                                   (*(Expr **)((long)pWVar7 + lVar23 + -0x14),iVar15,pIdx);
                if (iVar14 != 0) {
                  uVar16 = *(ushort *)((long)pWVar7 + lVar23 + -4);
                  if (0 < (short)uVar16) {
                    uVar16 = -(ushort)((*(byte *)((long)&pWVar7->pExpr + lVar23) & 0x82) == 0) |
                             0xffec;
                  }
                  sVar22 = uVar16 + sVar22;
                }
                if (iVar14 == 0) break;
                lVar24 = lVar24 + 1;
                lVar23 = lVar23 + 0x40;
              } while (lVar24 < (local_f0->sWC).nTerm);
            }
            LVar13 = sqlite3LogEstAdd(pTemplate->rRun,sVar22);
            pTemplate->rRun = LVar13;
          }
          whereLoopOutputAdjust(local_f8,pTemplate,LVar11);
          iVar15 = whereLoopInsert(pBuilder,pTemplate);
          pTemplate->nOut = LVar11;
          if (iVar15 == 0) goto LAB_00185645;
          bVar9 = false;
        }
        else {
LAB_00185645:
          bVar9 = true;
          iVar15 = 0;
        }
        if (!bVar9) {
          return iVar15;
        }
      }
      pBuilder->bldFlags = 0;
      iVar15 = whereLoopAddBtreeIndex(pBuilder,pSVar5->a + bVar2,pIdx,0);
      if (pBuilder->bldFlags == 1) {
        pbVar1 = (byte *)((long)&pTVar6->tabFlags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      p = pBuilder->pRec;
      if (p != (UnpackedRecord *)0x0) {
        p_01 = p->aMem;
        db = p_01->db;
        for (uVar18 = (ulong)p->pKeyInfo->nAllField; uVar18 != 0; uVar18 = uVar18 - 1) {
          if (((p_01->flags & 0x2400) != 0) || (p_01->szMalloc != 0)) {
            vdbeMemClear(p_01);
          }
          p_01 = p_01 + 1;
        }
        p_00 = p->pKeyInfo;
        if ((p_00 != (KeyInfo *)0x0) && (p_00->nRef = p_00->nRef - 1, p_00->nRef == 0)) {
          sqlite3DbFreeNN(p_00->db,p_00);
        }
        sqlite3DbFreeNN(db,p);
      }
      pBuilder->nRecValid = 0;
      pBuilder->pRec = (UnpackedRecord *)0x0;
    }
    else {
      iVar15 = 0;
    }
    if (pSVar5->a[bVar2].pIBIndex == (Index *)0x0) {
      pIdx = pIdx->pNext;
    }
    else {
      pIdx = (Index *)0x0;
    }
    if (iVar15 != 0) {
      return iVar15;
    }
    uVar20 = uVar20 + '\x01';
    if (pIdx == (Index *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    sPk.idxType = SQLITE_IDXTYPE_IPK;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}